

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::ComputeHints
          (Prog *this,vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,int begin,
          int end)

{
  bool bVar1;
  int iVar2;
  InstOp IVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  int *piVar8;
  int in_ECX;
  int in_EDX;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *in_RSI;
  uint16_t hint;
  int foldhi;
  int foldlo;
  int hi;
  int lo;
  Inst *ip;
  anon_class_32_4_bbdeb633 Recolor;
  int first;
  int id;
  bool dirty;
  int colors [256];
  Bitmap256 splits;
  int local_48c;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int local_440;
  Bitmap256 local_38;
  int local_18;
  int local_14;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  Bitmap256::Bitmap256((Bitmap256 *)0x25fe72);
  bVar1 = false;
  local_440 = local_18;
  do {
    if (local_440 < local_14) {
      return;
    }
    if (local_440 == local_18) {
LAB_0025febf:
      if (bVar1) {
        bVar1 = false;
        Bitmap256::Clear((Bitmap256 *)0x25fed8);
      }
      Bitmap256::Set(&local_38,0xff);
    }
    else {
      pvVar7 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::operator[]
                         (local_10,(long)local_440);
      IVar3 = Inst::opcode(pvVar7);
      iVar2 = local_18;
      if (IVar3 != kInstByteRange) goto LAB_0025febf;
      bVar1 = true;
      pvVar7 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::operator[]
                         (local_10,(long)local_440);
      iVar4 = Inst::lo(pvVar7);
      iVar5 = Inst::hi(pvVar7);
      ComputeHints::anon_class_32_4_bbdeb633::operator()
                ((anon_class_32_4_bbdeb633 *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
      iVar6 = Inst::foldcase(pvVar7);
      if (((iVar6 != 0) && (iVar4 < 0x7b)) && (0x60 < iVar5)) {
        in_stack_fffffffffffffb84 = iVar4;
        if (iVar4 < 0x61) {
          in_stack_fffffffffffffb84 = 0x61;
        }
        in_stack_fffffffffffffb80 = iVar5;
        if (0x7a < iVar5) {
          in_stack_fffffffffffffb80 = 0x7a;
        }
        if (in_stack_fffffffffffffb84 <= in_stack_fffffffffffffb80) {
          in_stack_fffffffffffffb84 = in_stack_fffffffffffffb84 + -0x20;
          in_stack_fffffffffffffb80 = in_stack_fffffffffffffb80 + -0x20;
          ComputeHints::anon_class_32_4_bbdeb633::operator()
                    ((anon_class_32_4_bbdeb633 *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
        }
      }
      if (iVar2 != local_18) {
        in_stack_fffffffffffffb78 = iVar2 - local_440;
        local_48c = 0x7fff;
        piVar8 = std::min<int>((int *)&stack0xfffffffffffffb78,&local_48c);
        in_stack_fffffffffffffb7c = CONCAT22((short)*piVar8,(short)in_stack_fffffffffffffb7c);
        (pvVar7->field_1).field_3.hint_foldcase_ =
             (pvVar7->field_1).field_3.hint_foldcase_ | (short)*piVar8 << 1;
      }
    }
    local_440 = local_440 + -1;
  } while( true );
}

Assistant:

void Prog::ComputeHints(std::vector<Inst>* flat, int begin, int end) {
  Bitmap256 splits;
  int colors[256];

  bool dirty = false;
  for (int id = end; id >= begin; --id) {
    if (id == end ||
        (*flat)[id].opcode() != kInstByteRange) {
      if (dirty) {
        dirty = false;
        splits.Clear();
      }
      splits.Set(255);
      colors[255] = id;
      // At this point, the [0-255] range is colored with id.
      // Thus, hints cannot point beyond id; and if id == end,
      // hints that would have pointed to id will be 0 instead.
      continue;
    }
    dirty = true;

    // We recolor the [lo-hi] range with id. Note that first ratchets backwards
    // from end to the nearest conflict (if any) during recoloring.
    int first = end;
    auto Recolor = [&](int lo, int hi) {
      // Like ByteMapBuilder, we split at lo-1 and at hi.
      --lo;

      if (0 <= lo && !splits.Test(lo)) {
        splits.Set(lo);
        int next = splits.FindNextSetBit(lo+1);
        colors[lo] = colors[next];
      }
      if (!splits.Test(hi)) {
        splits.Set(hi);
        int next = splits.FindNextSetBit(hi+1);
        colors[hi] = colors[next];
      }

      int c = lo+1;
      while (c < 256) {
        int next = splits.FindNextSetBit(c);
        // Ratchet backwards...
        first = std::min(first, colors[next]);
        // Recolor with id - because it's the new nearest conflict!
        colors[next] = id;
        if (next == hi)
          break;
        c = next+1;
      }
    };

    Inst* ip = &(*flat)[id];
    int lo = ip->lo();
    int hi = ip->hi();
    Recolor(lo, hi);
    if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
      int foldlo = lo;
      int foldhi = hi;
      if (foldlo < 'a')
        foldlo = 'a';
      if (foldhi > 'z')
        foldhi = 'z';
      if (foldlo <= foldhi) {
        foldlo += 'A' - 'a';
        foldhi += 'A' - 'a';
        Recolor(foldlo, foldhi);
      }
    }

    if (first != end) {
      uint16_t hint = static_cast<uint16_t>(std::min(first - id, 32767));
      ip->hint_foldcase_ |= hint<<1;
    }
  }
}